

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileLog.h
# Opt level: O1

void __thiscall
FIX::FileLogFactory::FileLogFactory(FileLogFactory *this,string *path,string *backupPath)

{
  pointer pcVar1;
  
  *(code **)this = recv;
  *(FileLogFactory **)(this + 8) = this + 0x18;
  pcVar1 = (path->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(this + 8),pcVar1,pcVar1 + path->_M_string_length);
  *(FileLogFactory **)(this + 0x28) = this + 0x38;
  pcVar1 = (backupPath->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(this + 0x28),pcVar1,pcVar1 + backupPath->_M_string_length);
  *(undefined4 *)(this + 0x50) = 0;
  *(undefined8 *)(this + 0x58) = 0;
  *(FileLogFactory **)(this + 0x60) = this + 0x50;
  *(FileLogFactory **)(this + 0x68) = this + 0x50;
  *(undefined8 *)(this + 0x70) = 0;
  *(undefined ***)(this + 0x78) = &PTR__Dictionary_003262d8;
  *(undefined4 *)(this + 0x88) = 0;
  *(undefined8 *)(this + 0x90) = 0;
  *(FileLogFactory **)(this + 0x98) = this + 0x88;
  *(FileLogFactory **)(this + 0xa0) = this + 0x88;
  *(undefined8 *)(this + 0xa8) = 0;
  *(FileLogFactory **)(this + 0xb0) = this + 0xc0;
  *(undefined8 *)(this + 0xb8) = 0;
  this[0xc0] = (FileLogFactory)0x0;
  this[0xd0] = (FileLogFactory)0x0;
  *(undefined8 *)(this + 0xd8) = 0;
  *(undefined4 *)(this + 0xe0) = 0;
  return;
}

Assistant:

FileLogFactory( const std::string& path, const std::string& backupPath )
: m_path( path ), m_backupPath( backupPath ), m_globalLog(0), m_globalLogCount(0) {}